

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_node.cpp
# Opt level: O3

void tst_node_cast(void)

{
  OpacityNode *pOVar1;
  TextureNode *pTVar2;
  TransformNode *pTVar3;
  RectangleNode *pRVar4;
  ColorFilterNode *pCVar5;
  BlurNode *pBVar6;
  ShadowNode *pSVar7;
  
  pOVar1 = rengine::OpacityNode::create();
  if ((pOVar1 != (OpacityNode *)0x0) && ((pOVar1->super_Node).field_0x30 != '\x02')) {
    pOVar1 = rengine::OpacityNode::create();
    if ((pOVar1 != (OpacityNode *)0x0) && ((pOVar1->super_Node).field_0x30 != '\x02')) {
      __assert_fail("tst_node_cast_helper<OpacityNode>()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_node.cpp"
                    ,0x26,"void tst_node_cast()");
    }
  }
  pTVar2 = rengine::TextureNode::create();
  if ((pTVar2 != (TextureNode *)0x0) &&
     ((pTVar2->super_RectangleNodeBase).super_Node.field_0x30 != 'B')) {
    pTVar2 = rengine::TextureNode::create();
    if ((pTVar2 != (TextureNode *)0x0) &&
       ((pTVar2->super_RectangleNodeBase).super_Node.field_0x30 != 'B')) {
      __assert_fail("tst_node_cast_helper<TextureNode>()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_node.cpp"
                    ,0x27,"void tst_node_cast()");
    }
  }
  pTVar3 = rengine::TransformNode::create();
  if ((pTVar3 != (TransformNode *)0x0) && ((pTVar3->super_Node).field_0x30 != '\x01')) {
    pTVar3 = rengine::TransformNode::create();
    if ((pTVar3 != (TransformNode *)0x0) && ((pTVar3->super_Node).field_0x30 != '\x01')) {
      __assert_fail("tst_node_cast_helper<TransformNode>()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_node.cpp"
                    ,0x28,"void tst_node_cast()");
    }
  }
  pRVar4 = rengine::RectangleNode::create();
  if ((pRVar4 != (RectangleNode *)0x0) &&
     ((pRVar4->super_RectangleNodeBase).super_Node.field_0x30 != 'A')) {
    pRVar4 = rengine::RectangleNode::create();
    if ((pRVar4 != (RectangleNode *)0x0) &&
       ((pRVar4->super_RectangleNodeBase).super_Node.field_0x30 != 'A')) {
      __assert_fail("tst_node_cast_helper<RectangleNode>()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_node.cpp"
                    ,0x29,"void tst_node_cast()");
    }
  }
  pCVar5 = rengine::ColorFilterNode::create();
  if ((pCVar5 != (ColorFilterNode *)0x0) && ((pCVar5->super_Node).field_0x30 != '\x03')) {
    pCVar5 = rengine::ColorFilterNode::create();
    if ((pCVar5 != (ColorFilterNode *)0x0) && ((pCVar5->super_Node).field_0x30 != '\x03')) {
      __assert_fail("tst_node_cast_helper<ColorFilterNode>()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_node.cpp"
                    ,0x2a,"void tst_node_cast()");
    }
  }
  pBVar6 = rengine::BlurNode::create();
  if ((pBVar6 != (BlurNode *)0x0) && ((pBVar6->super_Node).field_0x30 != '\x04')) {
    pBVar6 = rengine::BlurNode::create();
    if ((pBVar6 != (BlurNode *)0x0) && ((pBVar6->super_Node).field_0x30 != '\x04')) {
      __assert_fail("tst_node_cast_helper<BlurNode>()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_node.cpp"
                    ,0x2b,"void tst_node_cast()");
    }
  }
  pSVar7 = rengine::ShadowNode::create();
  if ((pSVar7 != (ShadowNode *)0x0) && ((pSVar7->super_Node).field_0x30 != '\x05')) {
    pSVar7 = rengine::ShadowNode::create();
    if ((pSVar7 != (ShadowNode *)0x0) && ((pSVar7->super_Node).field_0x30 != '\x05')) {
      __assert_fail("tst_node_cast_helper<ShadowNode>()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_node.cpp"
                    ,0x2c,"void tst_node_cast()");
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"tst_node_cast",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ok",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void tst_node_cast()
{
    check_true(tst_node_cast_helper<OpacityNode>());
    check_true(tst_node_cast_helper<TextureNode>());
    check_true(tst_node_cast_helper<TransformNode>());
    check_true(tst_node_cast_helper<RectangleNode>());
    check_true(tst_node_cast_helper<ColorFilterNode>());
    check_true(tst_node_cast_helper<BlurNode>());
    check_true(tst_node_cast_helper<ShadowNode>());

    cout << __FUNCTION__ << ": ok" << endl;
}